

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2Polygons(LWOImporter *this,uint length)

{
  uint *puVar1;
  Logger *pLVar2;
  uint uVar3;
  char *message;
  uint16_t *cursor;
  uint iNumVertices;
  uint iNumFaces;
  iterator it;
  
  puVar1 = (uint *)this->mFileBuffer;
  uVar3 = *puVar1;
  this->mFileBuffer = (uint8_t *)(puVar1 + 1);
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  if (uVar3 == 0x424f4e45) goto LAB_00405d4a;
  if (uVar3 == 0x43555256) {
    pLVar2 = DefaultLogger::get();
    message = "LWO2: Encountered unsupported primitive chunk (SPLINE)";
  }
  else {
    if (((uVar3 == 0x46414345) || (uVar3 == 0x53554244)) || (uVar3 == 0x50544348))
    goto LAB_00405d4a;
    if (uVar3 != 0x4d42414c) {
      pLVar2 = DefaultLogger::get();
      Logger::error(pLVar2,"LWO2: Ignoring unknown polygon type.");
      goto LAB_00405d4a;
    }
    pLVar2 = DefaultLogger::get();
    message = "LWO2: Encountered unsupported primitive chunk (METABALL)";
  }
  Logger::warn(pLVar2,message);
LAB_00405d4a:
  cursor = (uint16_t *)this->mFileBuffer;
  iNumFaces = 0;
  iNumVertices = 0;
  CountVertsAndFacesLWO2
            (this,&iNumVertices,&iNumFaces,&cursor,(uint16_t *)((ulong)length + (long)puVar1),
             0xffffffff);
  if ((ulong)iNumFaces != 0) {
    cursor = (uint16_t *)this->mFileBuffer;
    it._M_current = (Face *)((ulong)it._M_current._4_4_ << 0x20);
    std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::resize
              (&this->mCurLayer->mFaces,(ulong)iNumFaces,(value_type *)&it);
    aiFace::~aiFace((aiFace *)&it);
    it._M_current =
         (this->mCurLayer->mFaces).
         super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
         super__Vector_impl_data._M_start;
    CopyFaceIndicesLWO2(this,&it,&cursor,(uint16_t *)((ulong)length + (long)puVar1));
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Polygons(unsigned int length)
{
    LE_NCONST uint16_t* const end   = (LE_NCONST uint16_t*)(mFileBuffer+length);
    const uint32_t type = GetU4();

    // Determine the type of the polygons
    switch (type)
    {
        // read unsupported stuff too (although we won't process it)
    case  AI_LWO_MBAL:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (METABALL)");
        break;
    case  AI_LWO_CURV:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (SPLINE)");;
        break;

        // These are ok with no restrictions
    case  AI_LWO_PTCH:
    case  AI_LWO_FACE:
    case  AI_LWO_BONE:
    case  AI_LWO_SUBD:
        break;
    default:

        // hm!? wtf is this? ok ...
        ASSIMP_LOG_ERROR("LWO2: Ignoring unknown polygon type.");
        break;
    }

    // first find out how many faces and vertices we'll finally need
    uint16_t* cursor= (uint16_t*)mFileBuffer;

    unsigned int iNumFaces = 0,iNumVertices = 0;
    CountVertsAndFacesLWO2(iNumVertices,iNumFaces,cursor,end);

    // allocate the output array and copy face indices
    if (iNumFaces)
    {
        cursor = (uint16_t*)mFileBuffer;

        mCurLayer->mFaces.resize(iNumFaces,LWO::Face(type));
        FaceList::iterator it = mCurLayer->mFaces.begin();
        CopyFaceIndicesLWO2(it,cursor,end);
    }
}